

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTable.cpp
# Opt level: O0

void __thiscall UnitTest_table3::UnitTest_table3(UnitTest_table3 *this)

{
  undefined8 *in_RDI;
  UnitTestBase *unaff_retaddr;
  
  UnitTestBase::UnitTestBase(unaff_retaddr);
  *in_RDI = &PTR_Run_0026a6e0;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"table3");
  return;
}

Assistant:

TEST_CASE(table3)
{
    luna::Table t;
    luna::Value key;
    luna::Value value;

    key.type_ = luna::ValueT_Bool;
    key.bvalue_ = true;

    value.type_ = luna::ValueT_Bool;
    value.bvalue_ = false;

    t.SetValue(key, value);
    value = t.GetValue(key);
    EXPECT_TRUE(value.type_ == luna::ValueT_Bool);
    EXPECT_TRUE(value.bvalue_ == false);

    t.SetValue(value, key);
    key = t.GetValue(value);
    EXPECT_TRUE(key.type_ == luna::ValueT_Bool);
    EXPECT_TRUE(key.bvalue_ == true);

    luna::Value nil;
    value = t.GetValue(nil);
    EXPECT_TRUE(value.type_ == luna::ValueT_Nil);
}